

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutils.c
# Opt level: O3

int dbuf_write(DynBuf *s,size_t offset,uint8_t *data,size_t len)

{
  size_t new_size;
  int iVar1;
  int iVar2;
  
  new_size = len + offset;
  iVar1 = dbuf_realloc(s,new_size);
  iVar2 = -1;
  if (iVar1 == 0) {
    memcpy(s->buf + offset,data,len);
    iVar2 = 0;
    if (s->size < new_size) {
      s->size = new_size;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int dbuf_write(DynBuf *s, size_t offset, const uint8_t *data, size_t len)
{
    size_t end;
    end = offset + len;
    if (dbuf_realloc(s, end))
        return -1;
    memcpy(s->buf + offset, data, len);
    if (end > s->size)
        s->size = end;
    return 0;
}